

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_TestShell::
createTest(TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_TestShell
           *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
                                  ,0x4b);
  TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_Test::
  TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_Test
            ((TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_Test
              *)this_00);
  return this_00;
}

Assistant:

TEST(MockHierarchyTest, EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated)
{
    mock().disable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(0, mock("first").expectedCallsLeft());

    mock().enable();
    mock("second").expectOneCall("boo");
    LONGS_EQUAL(1, mock("second").expectedCallsLeft());

    mock().clear();
}